

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock-spec-builders.h
# Opt level: O2

TypedExpectation<ot::commissioner::State_()> * __thiscall
testing::internal::TypedExpectation<ot::commissioner::State_()>::WillOnce
          (TypedExpectation<ot::commissioner::State_()> *this,
          Action<ot::commissioner::State_()> *action)

{
  Clause CVar1;
  function<ot::commissioner::State_()> *this_00;
  allocator local_41;
  string local_40;
  
  CVar1 = (this->super_ExpectationBase).last_clause_;
  std::__cxx11::string::string
            ((string *)&local_40,
             ".WillOnce() cannot appear after .WillRepeatedly() or .RetiresOnSaturation().",
             &local_41);
  ExpectationBase::ExpectSpecProperty(&this->super_ExpectationBase,(int)CVar1 < 6,&local_40);
  std::__cxx11::string::~string((string *)&local_40);
  (this->super_ExpectationBase).last_clause_ = kWillOnce;
  this_00 = (function<ot::commissioner::State_()> *)operator_new(0x20);
  std::function<ot::commissioner::State_()>::function(this_00,&action->fun_);
  local_40._M_dataplus._M_p = (pointer)this_00;
  std::vector<void_const*,std::allocator<void_const*>>::emplace_back<void_const*>
            ((vector<void_const*,std::allocator<void_const*>> *)
             &(this->super_ExpectationBase).untyped_actions_,(void **)&local_40);
  if ((this->super_ExpectationBase).cardinality_specified_ == false) {
    Exactly((testing *)&local_40,
            (int)((ulong)((long)(this->super_ExpectationBase).untyped_actions_.
                                super__Vector_base<const_void_*,_std::allocator<const_void_*>_>.
                                _M_impl.super__Vector_impl_data._M_finish -
                         (long)(this->super_ExpectationBase).untyped_actions_.
                               super__Vector_base<const_void_*,_std::allocator<const_void_*>_>.
                               _M_impl.super__Vector_impl_data._M_start) >> 3));
    std::__shared_ptr<const_testing::CardinalityInterface,_(__gnu_cxx::_Lock_policy)2>::operator=
              ((__shared_ptr<const_testing::CardinalityInterface,_(__gnu_cxx::_Lock_policy)2> *)
               &(this->super_ExpectationBase).cardinality_,
               (__shared_ptr<const_testing::CardinalityInterface,_(__gnu_cxx::_Lock_policy)2> *)
               &local_40);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&local_40._M_string_length);
  }
  return this;
}

Assistant:

TypedExpectation& WillOnce(const Action<F>& action) {
    ExpectSpecProperty(last_clause_ <= kWillOnce,
                       ".WillOnce() cannot appear after "
                       ".WillRepeatedly() or .RetiresOnSaturation().");
    last_clause_ = kWillOnce;

    untyped_actions_.push_back(new Action<F>(action));
    if (!cardinality_specified()) {
      set_cardinality(Exactly(static_cast<int>(untyped_actions_.size())));
    }
    return *this;
  }